

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O2

int gdTransformAffineGetImage(gdImagePtr *dst,gdImagePtr src,gdRectPtr src_area,double *affine)

{
  int iVar1;
  gdImagePtr pgVar2;
  int iVar3;
  gdRect bbox;
  gdRect local_78;
  double m [6];
  
  if (src_area == (gdRectPtr)0x0) {
    src_area = &local_78;
    local_78.x = 0;
    local_78.y = 0;
    local_78.width = src->sx;
    local_78.height = src->sy;
  }
  gdTransformAffineBoundingBox(src_area,affine,&bbox);
  pgVar2 = gdImageCreateTrueColor(bbox.width,bbox.height);
  *dst = pgVar2;
  if (pgVar2 == (gdImagePtr)0x0) {
    iVar3 = 0;
  }
  else {
    pgVar2->saveAlphaFlag = 1;
    if (src->trueColor == 0) {
      gdImagePaletteToTrueColor(src);
    }
    iVar3 = 0;
    gdAffineTranslate(m,(double)-bbox.x,(double)-bbox.y);
    gdAffineConcat(m,affine,m);
    gdImageAlphaBlending(*dst,0);
    iVar1 = gdTransformAffineCopy(*dst,0,0,src,src_area,m);
    if (iVar1 == 0) {
      gdImageDestroy(*dst);
      *dst = (gdImagePtr)0x0;
    }
    else {
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

BGD_DECLARE(int) gdTransformAffineGetImage(gdImagePtr *dst,
		  const gdImagePtr src,
		  gdRectPtr src_area,
		  const double affine[6])
{
	int res;
	double m[6];
	gdRect bbox;
	gdRect area_full;

	if (src_area == NULL) {
		area_full.x = 0;
		area_full.y = 0;
		area_full.width  = gdImageSX(src);
		area_full.height = gdImageSY(src);
		src_area = &area_full;
	}

	gdTransformAffineBoundingBox(src_area, affine, &bbox);

	*dst = gdImageCreateTrueColor(bbox.width, bbox.height);
	if (*dst == NULL) {
		return GD_FALSE;
	}
	(*dst)->saveAlphaFlag = 1;

	if (!src->trueColor) {
		gdImagePaletteToTrueColor(src);
	}
	
	/* Translate to dst origin (0,0) */
	gdAffineTranslate(m, -bbox.x, -bbox.y);
	gdAffineConcat(m, affine, m);

	gdImageAlphaBlending(*dst, 0);

	res = gdTransformAffineCopy(*dst,
		  0,0,
		  src,
		  src_area,
		  m);

	if (res != GD_TRUE) {
		gdImageDestroy(*dst);
		*dst = NULL;
		return GD_FALSE;
	} else {
		return GD_TRUE;
	}
}